

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::locate_soi_marker(jpeg_decoder *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  iVar5 = this->m_bits_left;
  uVar10 = this->m_bit_buf;
  iVar4 = iVar5 + -8;
  this->m_bits_left = iVar4;
  if (iVar5 < 9) {
    this->m_bit_buf = uVar10 << ((byte)iVar5 & 0x1f);
    iVar4 = this->m_in_buf_left;
    if (iVar4 == 0) {
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) goto LAB_0011fafc;
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      uVar9 = 0xd9;
      if (uVar7 == 0) {
        uVar9 = 0xff;
      }
LAB_0011fb45:
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011fb62;
      }
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar7 = 0xd9;
      if (uVar6 == 0) {
        uVar7 = 0xff;
      }
    }
    else {
LAB_0011fafc:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar9 = (uint)*pbVar3;
      iVar4 = iVar4 + -1;
      this->m_in_buf_left = iVar4;
      if (iVar4 == 0) goto LAB_0011fb45;
LAB_0011fb62:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar4 + -1;
      uVar7 = (uint)bVar1;
    }
    uVar9 = (uVar9 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
            (-(char)this->m_bits_left & 0x1fU);
    iVar4 = this->m_bits_left + 0x10;
  }
  else {
    uVar9 = uVar10 << 8;
  }
  iVar5 = iVar4 + -8;
  this->m_bits_left = iVar5;
  if (8 < iVar4) {
    uVar11 = uVar9 << 8;
    this->m_bit_buf = uVar11;
    goto LAB_0011fcae;
  }
  this->m_bit_buf = uVar9 << ((byte)iVar4 & 0x1f);
  iVar4 = this->m_in_buf_left;
  if (iVar4 == 0) {
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 != 0) goto LAB_0011fbce;
    uVar6 = this->m_tem_flag;
    this->m_tem_flag = uVar6 ^ 1;
    uVar7 = 0xd9;
    if (uVar6 == 0) {
      uVar7 = 0xff;
    }
LAB_0011fc4a:
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 != 0) {
      pbVar8 = this->m_pIn_buf_ofs;
      goto LAB_0011fc67;
    }
    uVar2 = this->m_tem_flag;
    this->m_tem_flag = uVar2 ^ 1;
    uVar6 = 0xd9;
    if (uVar2 == 0) {
      uVar6 = 0xff;
    }
  }
  else {
LAB_0011fbce:
    pbVar3 = this->m_pIn_buf_ofs;
    pbVar8 = pbVar3 + 1;
    this->m_pIn_buf_ofs = pbVar8;
    uVar7 = (uint)*pbVar3;
    iVar4 = iVar4 + -1;
    this->m_in_buf_left = iVar4;
    if (iVar4 == 0) goto LAB_0011fc4a;
LAB_0011fc67:
    this->m_pIn_buf_ofs = pbVar8 + 1;
    bVar1 = *pbVar8;
    this->m_in_buf_left = iVar4 + -1;
    uVar6 = (uint)bVar1;
  }
  uVar11 = (uVar7 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
           (-(char)this->m_bits_left & 0x1fU);
  this->m_bit_buf = uVar11;
  iVar5 = this->m_bits_left + 0x10;
  this->m_bits_left = iVar5;
LAB_0011fcae:
  if ((0xfeffffff < uVar10) && (uVar9 >> 0x18 == 0xd8)) {
    return;
  }
  iVar4 = -0xfff;
  uVar10 = uVar9 >> 0x18;
  do {
    this->m_bits_left = iVar5 + -8;
    if (iVar5 < 9) {
      this->m_bit_buf = uVar11 << ((byte)iVar5 & 0x1f);
      iVar5 = this->m_in_buf_left;
      if (iVar5 == 0) {
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) goto LAB_0011fd09;
        uVar7 = this->m_tem_flag;
        this->m_tem_flag = uVar7 ^ 1;
        uVar9 = 0xd9;
        if (uVar7 == 0) {
          uVar9 = 0xff;
        }
LAB_0011fd5a:
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) {
          pbVar8 = this->m_pIn_buf_ofs;
          goto LAB_0011fd73;
        }
        uVar6 = this->m_tem_flag;
        this->m_tem_flag = uVar6 ^ 1;
        uVar7 = 0xd9;
        if (uVar6 == 0) {
          uVar7 = 0xff;
        }
      }
      else {
LAB_0011fd09:
        pbVar3 = this->m_pIn_buf_ofs;
        pbVar8 = pbVar3 + 1;
        this->m_pIn_buf_ofs = pbVar8;
        uVar9 = (uint)*pbVar3;
        iVar5 = iVar5 + -1;
        this->m_in_buf_left = iVar5;
        if (iVar5 == 0) goto LAB_0011fd5a;
LAB_0011fd73:
        this->m_pIn_buf_ofs = pbVar8 + 1;
        uVar7 = (uint)*pbVar8;
        this->m_in_buf_left = iVar5 + -1;
      }
      uVar9 = (uVar9 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
              (-(char)this->m_bits_left & 0x1fU);
      this->m_bit_buf = uVar9;
      iVar5 = this->m_bits_left + 0x10;
      this->m_bits_left = iVar5;
    }
    else {
      uVar9 = uVar11 << 8;
      this->m_bit_buf = uVar9;
      iVar5 = iVar5 + -8;
    }
    uVar7 = uVar11 >> 0x18;
    if (uVar10 == 0xff) {
      if (uVar7 == 0xd8) {
        if (0xfeffffff < uVar9) {
          return;
        }
        break;
      }
      if (uVar7 == 0xd9) break;
    }
    iVar4 = iVar4 + 1;
    uVar11 = uVar9;
    uVar10 = uVar7;
  } while (iVar4 != 0);
  stop_decoding(this,JPGD_NOT_JPEG);
}

Assistant:

void jpeg_decoder::locate_soi_marker() {
  uint lastchar, thischar;
  uint bytesleft;

  lastchar = get_bits(8);

  thischar = get_bits(8);

  /* ok if it's a normal JPEG file without a special header */

  if ((lastchar == 0xFF) && (thischar == M_SOI))
    return;

  bytesleft = 4096;  //512;

  for (;;) {
    if (--bytesleft == 0)
      stop_decoding(JPGD_NOT_JPEG);

    lastchar = thischar;

    thischar = get_bits(8);

    if (lastchar == 0xFF) {
      if (thischar == M_SOI)
        break;
      else if (thischar == M_EOI)  // get_bits will keep returning M_EOI if we read past the end
        stop_decoding(JPGD_NOT_JPEG);
    }
  }

  // Check the next character after marker: if it's not 0xFF, it can't be the start of the next marker, so the file is bad.
  thischar = (m_bit_buf >> 24) & 0xFF;

  if (thischar != 0xFF)
    stop_decoding(JPGD_NOT_JPEG);
}